

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Node * __thiscall wasm::DataFlow::Graph::doVisitLoop(Graph *this,Loop *curr)

{
  Locals *__x;
  mapped_type pEVar1;
  Node *other;
  Node *this_00;
  __uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> _Var2;
  undefined8 *puVar3;
  pointer ppNVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Node **node;
  mapped_type *ppEVar8;
  pointer ppNVar9;
  Type TVar10;
  Node *pNVar11;
  ulong uVar12;
  mapped_type *pmVar13;
  ulong uVar14;
  pointer ppNVar15;
  bool bVar16;
  Node **value;
  pointer puVar17;
  undefined8 *puVar18;
  pointer pvVar19;
  pointer ppNVar20;
  undefined1 local_98 [8];
  Locals vars;
  undefined1 local_68 [8];
  Locals previous;
  
  pEVar1 = this->parent;
  local_68 = (undefined1  [8])curr;
  ppEVar8 = std::__detail::
            _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->expressionParentMap,(key_type *)local_68);
  *ppEVar8 = pEVar1;
  this->parent = (Expression *)curr;
  if ((this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((curr->name).super_IString.str._M_str == (char *)0x0) {
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
    }
    else {
      __x = &this->locals;
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_68
                 ,__x);
      ppNVar9 = (pointer)Function::getNumLocals(this->func);
      if (ppNVar9 != (pointer)0x0) {
        ppNVar20 = (pointer)0x0;
        do {
          TVar10 = Function::getLocalType(this->func,(Index)ppNVar20);
          pNVar11 = makeVar(this,TVar10);
          (__x->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)
          ._M_impl.super__Vector_impl_data._M_start[(long)ppNVar20] = pNVar11;
          ppNVar20 = (pointer)(ulong)((Index)ppNVar20 + 1);
        } while (ppNVar20 < ppNVar9);
      }
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_98
                 ,__x);
      uVar12 = (long)(this->nodes).
                     super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes).
                     super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
      pmVar13 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->breakStates,&curr->name);
      if (ppNVar9 != (pointer)0x0) {
        ppNVar20 = (pointer)0x0;
        do {
          TVar10 = Function::getLocalType(this->func,(Index)ppNVar20);
          if ((TVar10.id & 0xfffffffffffffffe) == 2) {
            pNVar11 = *(pointer)((long)local_98 + ppNVar20 * 8);
            other = *(Node **)(&(((SpecificExpression<(wasm::Expression::Id)3> *)local_68)->
                                super_Expression)._id + (long)ppNVar20 * 8);
            pvVar19 = (pmVar13->
                      super__Vector_base<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            vars.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pmVar13->
                          super__Vector_base<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
            if (pvVar19 !=
                (pointer)vars.
                         super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              previous.
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppNVar20;
              bVar5 = false;
              do {
                ppNVar20 = (pvVar19->
                           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                if (ppNVar20 ==
                    (pvVar19->
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  __assert_fail("!isInUnreachable(other)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                                ,0x14e,"Node *wasm::DataFlow::Graph::doVisitLoop(Loop *)");
                }
                this_00 = ppNVar20[(long)previous.
                                         super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage];
                bVar6 = Node::operator==(this_00,pNVar11);
                if (bVar6) {
LAB_00833d9b:
                  bVar6 = false;
                  bVar16 = bVar5;
                }
                else {
                  bVar7 = Node::operator==(this_00,other);
                  bVar6 = true;
                  bVar16 = true;
                  if (bVar7) goto LAB_00833d9b;
                }
              } while ((!bVar6) &&
                      (pvVar19 = pvVar19 + 1, bVar5 = bVar16,
                      pvVar19 !=
                      (pointer)vars.
                               super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage));
              ppNVar20 = previous.
                         super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (bVar16) goto LAB_00833dba;
            }
            puVar17 = (this->nodes).
                      super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)uVar12 >> 3;
            if (uVar12 < (ulong)((long)(this->nodes).
                                       super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar17))
            {
              do {
                _Var2._M_t.
                super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl =
                     puVar17[uVar14]._M_t.
                     super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
                     ._M_t;
                puVar3 = *(undefined8 **)
                          ((long)_Var2._M_t.
                                 super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                                 .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl
                          + 0x20);
                for (puVar18 = *(undefined8 **)
                                ((long)_Var2._M_t.
                                       super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                                       .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>.
                                       _M_head_impl + 0x18); puVar18 != puVar3;
                    puVar18 = puVar18 + 1) {
                  if ((Node *)*puVar18 == pNVar11) {
                    *puVar18 = other;
                  }
                }
                uVar14 = uVar14 + 1;
                puVar17 = (this->nodes).
                          super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              } while (uVar14 < (ulong)((long)(this->nodes).
                                              super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)puVar17 >> 3));
            }
            ppNVar4 = (this->locals).
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppNVar15 = (this->locals).
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppNVar15 != ppNVar4;
                ppNVar15 = ppNVar15 + 1) {
              if (*ppNVar15 == pNVar11) {
                *ppNVar15 = other;
              }
            }
          }
LAB_00833dba:
          ppNVar20 = (pointer)(ulong)((int)ppNVar20 + 1);
        } while (ppNVar20 < ppNVar9);
      }
      if (local_98 != (undefined1  [8])0x0) {
        operator_delete((void *)local_98,
                        (long)vars.
                              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_98);
      }
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68,
                        (long)previous.
                              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_68);
      }
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitLoop(Loop* curr) {
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    // As in Souper's LLVM extractor, we avoid loop phis, as we don't want
    // our traces to represent a value that differs across loop iterations.
    // For example,
    //   %b = block
    //   %x = phi %b, 1, %y
    //   %y = phi %b, 2, %x
    //   %z = eq %x %y
    //   infer %z
    // Here %y refers to the previous iteration's %x.
    // To do this, we set all locals to a Var at the loop entry, then process
    // the inside of the loop. When that is done, we can see if a phi was
    // actually needed for each local. If it was, we leave the Var (it
    // represents an unknown value; analysis stops there), and if not, we
    // can replace the Var with the fixed value.
    // TODO: perhaps some more general uses of DataFlow will want loop phis?
    // TODO: optimize stuff here
    if (isInUnreachable()) {
      return &bad; // none of this matters
    }
    if (!curr->name.is()) {
      visit(curr->body);
      return &bad; // no phis are possible
    }
    auto previous = locals;
    auto numLocals = func->getNumLocals();
    for (Index i = 0; i < numLocals; i++) {
      locals[i] = makeVar(func->getLocalType(i));
    }
    auto vars = locals; // all the Vars we just created
    // We may need to replace values later - only new nodes added from
    // here are relevant.
    auto firstNodeFromLoop = nodes.size();
    // Process the loop body.
    visit(curr->body);
    // Find all incoming paths.
    auto& breaks = breakStates[curr->name];
    // Phis are possible, check for them.
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      bool needPhi = false;
      // We replaced the proper value with a Var. If it's still that
      // Var - or it's the original proper value, which can happen with
      // constants - on all incoming paths, then a phi is not needed.
      auto* var = vars[i];
      auto* proper = previous[i];
      for (auto& other : breaks) {
        assert(!isInUnreachable(other));
        auto& curr = *(other[i]);
        if (curr != *var && curr != *proper) {
          // A phi would be necessary here.
          needPhi = true;
          break;
        }
      }
      if (needPhi) {
        // Nothing to do - leave the Vars, the loop phis are
        // unknown values to us.
      } else {
        // Undo the Var for this local: In every new node added for
        // the loop body, replace references to the Var with the
        // previous value (the value that is all we need instead of a phi).
        for (auto j = firstNodeFromLoop; j < nodes.size(); j++) {
          for (auto*& value : nodes[j].get()->values) {
            if (value == var) {
              value = proper;
            }
          }
        }
        // Also undo in the current local state, which is flowing out
        // of the loop.
        for (auto*& node : locals) {
          if (node == var) {
            node = proper;
          }
        }
      }
    }
    return &bad;
  }